

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall Minisat::Solver::garbageCollect(Solver *this)

{
  uint *__ptr;
  ClauseAllocator local_38;
  
  local_38.ra.memory = (uint *)0x0;
  local_38.ra.sz = 0;
  local_38.ra.cap = 0;
  local_38.ra.wasted_ = 0;
  RegionAllocator<unsigned_int>::capacity(&local_38.ra,(this->ca).ra.sz - (this->ca).ra.wasted_);
  local_38.extra_clause_field = false;
  relocAll(this,&local_38);
  if (1 < this->verbosity) {
    printf("|  Garbage collection:   %12d bytes => %12d bytes             |\n",
           (ulong)((this->ca).ra.sz << 2),(ulong)(local_38.ra.sz << 2));
  }
  (this->ca).extra_clause_field = local_38.extra_clause_field;
  __ptr = (this->ca).ra.memory;
  if (__ptr != (uint *)0x0) {
    free(__ptr);
  }
  (this->ca).ra.memory = local_38.ra.memory;
  (this->ca).ra.sz = local_38.ra.sz;
  (this->ca).ra.cap = local_38.ra.cap;
  (this->ca).ra.wasted_ = local_38.ra.wasted_;
  return;
}

Assistant:

void Solver::garbageCollect()
{
    // Initialize the next region to a size corresponding to the estimated utilization degree. This
    // is not precise but should avoid some unnecessary reallocations for the new region:
    ClauseAllocator to(ca.size() - ca.wasted()); 

    relocAll(to);
    if (verbosity >= 2)
        printf("|  Garbage collection:   %12d bytes => %12d bytes             |\n", 
               ca.size()*ClauseAllocator::Unit_Size, to.size()*ClauseAllocator::Unit_Size);
    to.moveTo(ca);
}